

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::FixedRate::deltaRule(FixedRate *this,Array *var,Array *grad)

{
  float fVar1;
  size_t sVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  
  sVar2 = var->_M_size;
  if (deltaRule(std::valarray<float>&,std::valarray<float>const&)::lastVar == '\0') {
    deltaRule();
  }
  if ((this->weightDecay != 0.0) || (NAN(this->weightDecay))) {
    if (deltaRule::lastVar._M_size != sVar2) {
      operator_delete(deltaRule::lastVar._M_data);
      deltaRule::lastVar._M_size = sVar2;
      deltaRule::lastVar._M_data = (float *)operator_new(sVar2 * 4);
    }
    pfVar3 = deltaRule::lastVar._M_data;
    if (sVar2 != 0) {
      memset(deltaRule::lastVar._M_data,0,sVar2 << 2);
    }
    if (deltaRule::lastVar._M_size == var->_M_size) {
      if (deltaRule::lastVar._M_size == 0) goto LAB_0011fe05;
      pfVar6 = var->_M_data;
    }
    else {
      if (pfVar3 != (float *)0x0) {
        operator_delete(pfVar3);
      }
      deltaRule::lastVar._M_size = var->_M_size;
      pfVar3 = (float *)operator_new(deltaRule::lastVar._M_size << 2);
      pfVar6 = var->_M_data;
      deltaRule::lastVar._M_data = pfVar3;
      if (pfVar6 == (float *)0x0) goto LAB_0011fe05;
    }
    memcpy(pfVar3,pfVar6,deltaRule::lastVar._M_size << 2);
  }
LAB_0011fe05:
  pfVar6 = grad->_M_data;
  pfVar3 = pfVar6 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar3 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  pfVar5 = var->_M_data;
  pfVar4 = pfVar5 + var->_M_size;
  if (var->_M_size == 0) {
    pfVar4 = (float *)0x0;
    pfVar5 = (float *)0x0;
  }
  internal::scaleAdd<float_const*,float*>(-this->learningRate,pfVar6,pfVar3,pfVar5,pfVar4);
  fVar1 = this->weightDecay;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  pfVar3 = deltaRule::lastVar._M_data + deltaRule::lastVar._M_size;
  pfVar6 = deltaRule::lastVar._M_data;
  if (deltaRule::lastVar._M_size == 0) {
    pfVar3 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  sVar2 = var->_M_size;
  pfVar5 = var->_M_data;
  pfVar4 = pfVar5 + sVar2;
  if (sVar2 == 0) {
    pfVar5 = (float *)0x0;
  }
  if (sVar2 == 0) {
    pfVar4 = (float *)0x0;
  }
  internal::scaleAdd<float*,float*>(fVar1 * this->learningRate * -2.0,pfVar6,pfVar3,pfVar5,pfVar4);
  return;
}

Assistant:

void deltaRule(Array& var, const Array &grad) {
        size_t n = var.size();
        static Array lastVar;
        if (weightDecay != 0) {
            lastVar.resize(n);
            lastVar = var;
        }
        // apply updates: var = var - eta * grad
        internal::scaleAdd(-learningRate,             // - eta
                std::begin(grad), std::end(grad),     // * grad
                std::begin(var), std::end(var));      // + var =: var
        // apply weight decay: var = var - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(lastVar), std::end(lastVar),
                std::begin(var), std::end(var));
        }
    }